

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O3

void lifesaved_monster(monst *mtmp,int adtyp)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  obj *obj;
  char *pcVar4;
  char *pcVar5;
  
  obj = mlifesaver(mtmp);
  if (obj == (obj *)0x0) goto LAB_001ea5d7;
  if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
    pline("But wait...");
    pcVar4 = Monnam(mtmp);
    pcVar4 = s_suffix(pcVar4);
    pline("%s medallion begins to glow!",pcVar4);
    discover_object(0xca,'\x01','\x01');
    bVar2 = attacktype(mtmp->data,0xd);
    pcVar4 = "%s reconstitutes!";
    if (((bVar2 == '\0') && (bVar2 = attacktype(mtmp->data,0xe), adtyp != 5)) && (bVar2 == '\0')) {
      if (mtmp->wormno == '\0') {
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001ea4b4;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001ea459;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001ea450;
        }
        else {
LAB_001ea450:
          if (ublindf == (obj *)0x0) goto LAB_001ea50e;
LAB_001ea459:
          if (ublindf->oartifact != '\x1d') goto LAB_001ea50e;
        }
        if (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
            (((youmonst.data)->mflags3 & 0x100) != 0)) &&
           (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 && ((mtmp->data->mflags3 & 0x200) != 0))))
        goto LAB_001ea4b4;
      }
      else {
        bVar2 = worm_known(level,mtmp);
        if (bVar2 != '\0') {
LAB_001ea4b4:
          uVar1 = *(uint *)&mtmp->field_0x60;
          if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar1 & 0x280) == 0) goto LAB_001ea4fc;
          }
          else if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001ea4fc:
            if ((u._1052_1_ & 0x20) == 0) {
              pcVar4 = "%s looks much better!";
              goto LAB_001ea515;
            }
          }
        }
      }
LAB_001ea50e:
      pcVar4 = "%s seems much better!";
    }
LAB_001ea515:
    pcVar5 = Monnam(mtmp);
    pline(pcVar4,pcVar5);
    pline("The medallion crumbles to dust!");
  }
  m_useup(mtmp,obj);
  uVar1 = *(uint *)&mtmp->field_0x60;
  *(uint *)&mtmp->field_0x60 = uVar1 | 0x40000;
  mtmp->mfrozen = '\0';
  if ((uVar1 >> 0x1a & 1) == 0 && mtmp->mtame != '\0') {
    wary_dog(mtmp,'\0');
  }
  iVar3 = mtmp->mhpmax;
  if (iVar3 < 1) {
    mtmp->mhpmax = 10;
    iVar3 = 10;
  }
  mtmp->mhp = iVar3;
  iVar3 = monsndx(mtmp->data);
  if ((mvitals[iVar3].mvflags & 2) == 0) {
    return;
  }
  if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
    pcVar4 = mon_nam(mtmp);
    pline("Unfortunately %s is still genocided...",pcVar4);
  }
LAB_001ea5d7:
  mtmp->mhp = 0;
  return;
}

Assistant:

static void lifesaved_monster(struct monst *mtmp, int adtyp)
{
	struct obj *lifesave = mlifesaver(mtmp);

	if (lifesave) {
		/* not canseemon; amulets are on the head, so you don't want */
		/* to show this for a long worm with only a tail visible. */
		/* Nor do you check invisibility, because glowing and disinte- */
		/* grating amulets are always visible. */
		if (cansee(mtmp->mx, mtmp->my)) {
			pline("But wait...");
			pline("%s medallion begins to glow!",
				s_suffix(Monnam(mtmp)));
			makeknown(AMULET_OF_LIFE_SAVING);
			if (attacktype(mtmp->data, AT_EXPL)
			    || attacktype(mtmp->data, AT_BOOM)
			    || adtyp == AD_DISN)
				pline("%s reconstitutes!", Monnam(mtmp));
			else if (canseemon(level, mtmp))
				pline("%s looks much better!", Monnam(mtmp));
			else
				pline("%s seems much better!", Monnam(mtmp));
			pline("The medallion crumbles to dust!");
		}
		m_useup(mtmp, lifesave);
		mtmp->mcanmove = 1;
		mtmp->mfrozen = 0;
		if (mtmp->mtame && !mtmp->isminion) {
			wary_dog(mtmp, FALSE);
		}
		if (mtmp->mhpmax <= 0) mtmp->mhpmax = 10;
		mtmp->mhp = mtmp->mhpmax;
		if (mvitals[monsndx(mtmp->data)].mvflags & G_GENOD) {
			if (cansee(mtmp->mx, mtmp->my))
			    pline("Unfortunately %s is still genocided...",
				mon_nam(mtmp));
		} else
			return;
	}
	mtmp->mhp = 0;
}